

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O0

void __thiscall
Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addAtomConstraints
          (ComponentMap *this,SharedContext *comp)

{
  bool bVar1;
  MapRange MVar2;
  Result RVar3;
  Mapping *m;
  MapRange r;
  ClauseCreator cc2;
  ClauseCreator cc1;
  undefined4 in_stack_fffffffffffffe18;
  ConstraintType in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Solver *in_stack_fffffffffffffe38;
  uint32 flags;
  ClauseCreator *in_stack_fffffffffffffe40;
  Mapping *local_70;
  ClauseCreator local_30;
  
  SharedContext::master((SharedContext *)0x15dbb4);
  ClauseCreator::ClauseCreator(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  SharedContext::master((SharedContext *)0x15dbd1);
  ClauseCreator::ClauseCreator(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  ClauseCreator::addDefaultFlags(&local_30,0x100);
  ClauseCreator::start
            ((ClauseCreator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c);
  MVar2 = atoms((ComponentMap *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  for (local_70 = MVar2.first; local_70 != MVar2.second; local_70 = local_70 + 1) {
    Mapping::up((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    ClauseCreator::add((ClauseCreator *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    bVar1 = Mapping::disj(local_70);
    flags = (uint32)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    if (bVar1) {
      ClauseCreator::start
                ((ClauseCreator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe1c);
      Mapping::tp((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::add((ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Mapping::up((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::add((ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Mapping::hp((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::add((ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::end(in_stack_fffffffffffffe40,flags);
      ClauseCreator::start
                ((ClauseCreator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe1c);
      Mapping::hp((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::add((ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Mapping::tp((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::add((ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::end(in_stack_fffffffffffffe40,flags);
      ClauseCreator::start
                ((ClauseCreator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe1c);
      Mapping::hp((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ClauseCreator::add((ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Mapping::up((Mapping *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      in_stack_fffffffffffffe40 =
           ClauseCreator::add((ClauseCreator *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              (Literal *)
                              CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      RVar3 = ClauseCreator::end(in_stack_fffffffffffffe40,flags);
      in_stack_fffffffffffffe38 = (Solver *)RVar3.local;
    }
  }
  ClauseCreator::end(in_stack_fffffffffffffe40,(uint32)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  ClauseCreator::~ClauseCreator((ClauseCreator *)0x15e08b);
  ClauseCreator::~ClauseCreator((ClauseCreator *)0x15e098);
  return;
}

Assistant:

void PrgDepGraph::NonHcfComponent::ComponentMap::addAtomConstraints(SharedContext& comp) {
	ClauseCreator cc1(comp.master()), cc2(comp.master());
	cc1.addDefaultFlags(ClauseCreator::clause_force_simplify);
	cc1.start();
	for (MapRange r = atoms(); r.first != r.second; ++r.first) {
		const Mapping& m = *r.first;
		cc1.add(m.up());
		if (m.disj()) {
			cc2.start().add(~m.tp()).add(m.up()).add(m.hp()).end(); // [~tp v up v hp]
			cc2.start().add(~m.hp()).add(m.tp()).end();  // [~hp v tp]
			cc2.start().add(~m.hp()).add(~m.up()).end(); // [~hp v ~up]
		}
	}
	cc1.end();
}